

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O0

int __thiscall
ncnn::MemoryData::forward
          (MemoryData *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *param_2,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  reference pvVar2;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  long in_RDI;
  void *in_R8;
  bool bVar3;
  Mat *top_blob;
  Mat local_100;
  reference local_b8;
  long local_b0;
  int local_8c;
  int local_88;
  undefined4 local_84;
  reference local_80;
  reference local_78;
  reference local_70;
  Mat *local_68;
  int local_40;
  undefined4 local_3c;
  Mat *local_38;
  int local_30;
  undefined4 local_2c;
  reference local_28;
  void *local_20;
  
  local_b0 = in_RCX;
  local_b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  Mat::clone(&local_100,(__fn *)(in_RDI + 0xe8),*(void **)(local_b0 + 8),(int)in_RCX,in_R8);
  pvVar2 = local_b8;
  local_78 = local_b8;
  local_80 = &local_100;
  if (local_b8 != local_80) {
    if (local_100.refcount != (int *)0x0) {
      local_84 = 1;
      LOCK();
      local_88 = *local_100.refcount;
      *local_100.refcount = *local_100.refcount + 1;
      UNLOCK();
    }
    local_28 = local_b8;
    if (local_b8->refcount != (int *)0x0) {
      piVar1 = local_b8->refcount;
      local_2c = 0xffffffff;
      LOCK();
      local_30 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_30 == 1) {
        if (local_b8->allocator == (Allocator *)0x0) {
          local_20 = local_b8->data;
          if (local_20 != (void *)0x0) {
            free(local_20);
          }
        }
        else {
          (*local_b8->allocator->_vptr_Allocator[3])(local_b8->allocator,local_b8->data);
        }
      }
    }
    pvVar2->data = (void *)0x0;
    pvVar2->elemsize = 0;
    pvVar2->elempack = 0;
    pvVar2->dims = 0;
    pvVar2->w = 0;
    pvVar2->h = 0;
    pvVar2->d = 0;
    pvVar2->c = 0;
    pvVar2->cstep = 0;
    pvVar2->refcount = (int *)0x0;
    pvVar2->data = local_80->data;
    pvVar2->refcount = local_80->refcount;
    pvVar2->elemsize = local_80->elemsize;
    pvVar2->elempack = local_80->elempack;
    pvVar2->allocator = local_80->allocator;
    pvVar2->dims = local_80->dims;
    pvVar2->w = local_80->w;
    pvVar2->h = local_80->h;
    pvVar2->d = local_80->d;
    pvVar2->c = local_80->c;
    pvVar2->cstep = local_80->cstep;
  }
  local_70 = pvVar2;
  local_68 = &local_100;
  if (local_100.refcount != (int *)0x0) {
    local_3c = 0xffffffff;
    LOCK();
    local_40 = *local_100.refcount;
    *local_100.refcount = *local_100.refcount + -1;
    UNLOCK();
    if (local_40 == 1) {
      local_38 = local_68;
      if (local_100.allocator == (Allocator *)0x0) {
        if (local_100.data != (void *)0x0) {
          free(local_100.data);
        }
      }
      else {
        (*(local_100.allocator)->_vptr_Allocator[3])(local_100.allocator,local_100.data);
      }
    }
  }
  bVar3 = true;
  if (local_b8->data != (void *)0x0) {
    bVar3 = local_b8->cstep * (long)local_b8->c == 0;
  }
  if (bVar3) {
    local_8c = -100;
  }
  else {
    local_8c = 0;
  }
  return local_8c;
}

Assistant:

int MemoryData::forward(const std::vector<Mat>& /*bottom_blobs*/, std::vector<Mat>& top_blobs, const Option& opt) const
{
    Mat& top_blob = top_blobs[0];

    top_blob = data.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    return 0;
}